

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,ValueType type)

{
  void *__s;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  Value *in_stack_ffffffffffffffe0;
  
  Comments::Comments((Comments *)0x1fadf5);
  initBasic(in_stack_ffffffffffffffe0,(ValueType)((ulong)in_RDI >> 0x20),
            SUB81((ulong)in_RDI >> 0x18,0));
  switch(in_ESI) {
  case 0:
    break;
  case 1:
  case 2:
    *in_RDI = 0;
    break;
  case 3:
    *in_RDI = 0;
    break;
  case 4:
    *in_RDI = "";
    break;
  case 5:
    *(undefined1 *)in_RDI = 0;
    break;
  case 6:
  case 7:
    __s = operator_new(0x30);
    memset(__s,0,0x30);
    std::
    map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
    ::map((map<Json::Value::CZString,_Json::Value,_std::less<Json::Value::CZString>,_std::allocator<std::pair<const_Json::Value::CZString,_Json::Value>_>_>
           *)0x1faead);
    *in_RDI = __s;
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/hbrunie[P]PyFloT/external-deps/jsoncpp/src/lib_json/json_value.cpp"
                  ,0x175,"Json::Value::Value(ValueType)");
  }
  return;
}

Assistant:

Value::Value(ValueType type) {
  static char const emptyString[] = "";
  initBasic(type);
  switch (type) {
  case nullValue:
    break;
  case intValue:
  case uintValue:
    value_.int_ = 0;
    break;
  case realValue:
    value_.real_ = 0.0;
    break;
  case stringValue:
    // allocated_ == false, so this is safe.
    value_.string_ = const_cast<char*>(static_cast<char const*>(emptyString));
    break;
  case arrayValue:
  case objectValue:
    value_.map_ = new ObjectValues();
    break;
  case booleanValue:
    value_.bool_ = false;
    break;
  default:
    JSON_ASSERT_UNREACHABLE;
  }
}